

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMesh.c
# Opt level: O0

int Bmc_MeshAddOneHotness(satoko_t *pSat,int iFirst,int iLast)

{
  int iVar1;
  int local_1d8;
  int RetValue;
  int pLits [2];
  int nCount;
  int nVars;
  int pVars [100];
  int local_2c;
  int local_28;
  int v;
  int j;
  int i;
  int iLast_local;
  int iFirst_local;
  satoko_t *pSat_local;
  
  pLits[1] = 0;
  pLits[0] = 0;
  if ((iFirst < iLast) && (local_2c = iFirst, iLast < iFirst + 0x6e)) {
    do {
      if (iLast <= local_2c) {
        if (pLits[1] < 2) {
          pSat_local._4_4_ = 0;
        }
        else {
          for (v = 0; local_28 = v, v < pLits[1]; v = v + 1) {
            while (local_28 = local_28 + 1, local_28 < pLits[1]) {
              local_1d8 = Abc_Var2Lit((&nCount)[v],1);
              RetValue = Abc_Var2Lit((&nCount)[local_28],1);
              iVar1 = satoko_add_clause(pSat,&local_1d8,2);
              if (iVar1 == 0) {
                __assert_fail("RetValue",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                              ,0x59,"int Bmc_MeshAddOneHotness(satoko_t *, int, int)");
              }
              pLits[0] = pLits[0] + 1;
            }
          }
          pSat_local._4_4_ = pLits[0];
        }
        return pSat_local._4_4_;
      }
      iVar1 = Bmc_MeshVarValue(pSat,local_2c);
      if (iVar1 != 0) {
        if (99 < pLits[1]) {
          __assert_fail("nVars < 100",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                        ,0x4e,"int Bmc_MeshAddOneHotness(satoko_t *, int, int)");
        }
        (&nCount)[pLits[1]] = local_2c;
        pLits[1] = pLits[1] + 1;
      }
      local_2c = local_2c + 1;
    } while( true );
  }
  __assert_fail("iFirst < iLast && iFirst + 110 > iLast",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcMesh.c"
                ,0x4a,"int Bmc_MeshAddOneHotness(satoko_t *, int, int)");
}

Assistant:

int Bmc_MeshAddOneHotness( satoko_t * pSat, int iFirst, int iLast )
{
    int i, j, v, pVars[100], nVars  = 0, nCount = 0;
    assert( iFirst < iLast && iFirst + 110 > iLast );
    for ( v = iFirst; v < iLast; v++ )
        if ( Bmc_MeshVarValue(pSat, v) ) // v = 1
        {
            assert( nVars < 100 );
            pVars[ nVars++ ] = v;
        }
    if ( nVars <= 1 )
        return 0;
    for ( i = 0;   i < nVars; i++ )
    for ( j = i+1; j < nVars; j++ )
    {
        int pLits[2], RetValue;
        pLits[0] = Abc_Var2Lit( pVars[i], 1 );
        pLits[1] = Abc_Var2Lit( pVars[j], 1 );
        RetValue = satoko_add_clause( pSat, pLits, 2 );  assert( RetValue );
        nCount++;
    }
    return nCount;
}